

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

void __thiscall
ON_ArchivableDictionary::CopyValues(ON_ArchivableDictionary *this,ON_ArchivableDictionary *source)

{
  bool bVar1;
  int iVar2;
  map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  *this_00;
  reference __k;
  mapped_type *this_01;
  pointer pDVar3;
  undefined4 extraout_var;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  *entry;
  iterator __end2;
  iterator __begin2;
  map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  *__range2;
  ON_ArchivableDictionary *source_local;
  ON_ArchivableDictionary *this_local;
  
  if (this != source) {
    this_00 = &source->m_private->m_map;
    __end2 = std::
             map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
             ::begin(this_00);
    entry = (pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
             *)std::
               map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
               ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&entry), bVar1) {
      __k = std::
            _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
            ::operator*(&__end2);
      this_01 = std::
                map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
                ::operator[](&this->m_private->m_map,&__k->first);
      pDVar3 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                         (&__k->second);
      iVar2 = (*pDVar3->_vptr_DictionaryEntry[3])();
      std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::reset
                (this_01,(pointer)CONCAT44(extraout_var,iVar2));
      std::
      _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void ON_ArchivableDictionary::CopyValues(const ON_ArchivableDictionary& source)
{
  if (this != &source)
  {
    for (const auto& entry : source.m_private->m_map)
      m_private->m_map[entry.first].reset(entry.second->Duplicate());
  }
}